

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int tlsio_openssl_close(CONCRETE_IO_HANDLE tls_io,ON_IO_CLOSE_COMPLETE on_io_close_complete,
                       void *callback_context)

{
  _Bool _Var1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_1;
  TLS_IO_INSTANCE *tls_io_instance;
  LOGGER_LOG l;
  int result;
  void *callback_context_local;
  ON_IO_CLOSE_COMPLETE on_io_close_complete_local;
  CONCRETE_IO_HANDLE tls_io_local;
  
  if (tls_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_close",0x5c9,1,"NULL tls_io.");
    }
    l._4_4_ = 0x5ca;
  }
  else {
    if (((*(int *)((long)tls_io + 0x68) != 6) && (*(int *)((long)tls_io + 0x68) != 4)) &&
       (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
      (*p_Var3)(AZ_LOG_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_close",0x5d4,1,
                "Closing tlsio from a state other than TLSIO_STATE_EXT_OPEN or TLSIO_STATE_EXT_ERROR"
               );
    }
    _Var1 = is_an_opening_state(*(TLSIO_STATE *)((long)tls_io + 0x68));
    if (_Var1) {
      (**(code **)((long)tls_io + 0x10))(*(undefined8 *)((long)tls_io + 0x30),3);
    }
    if (*(int *)((long)tls_io + 0x68) == 4) {
      *(undefined4 *)((long)tls_io + 0x68) = 5;
      *(ON_IO_CLOSE_COMPLETE *)((long)tls_io + 0x18) = on_io_close_complete;
      *(void **)((long)tls_io + 0x38) = callback_context;
      iVar2 = xio_close(*tls_io,on_underlying_io_close_complete,tls_io);
      if (iVar2 != 0) {
        close_openssl_instance((TLS_IO_INSTANCE *)tls_io);
        *(undefined4 *)((long)tls_io + 0x68) = 0;
      }
    }
    else {
      xio_close(*tls_io,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      close_openssl_instance((TLS_IO_INSTANCE *)tls_io);
      *(undefined4 *)((long)tls_io + 0x68) = 0;
    }
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int tlsio_openssl_close(CONCRETE_IO_HANDLE tls_io, ON_IO_CLOSE_COMPLETE on_io_close_complete, void* callback_context)
{
    int result;

    /* Codes_SRS_TLSIO_30_050: [ If the tlsio_handle parameter is NULL, tlsio_close_async shall log an error and return _FAILURE_. ]*/
    if (tls_io == NULL)
    {
        LogError("NULL tls_io.");
        result = MU_FAILURE;
    }
    else
    {
        TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)tls_io;

        if (tls_io_instance->tlsio_state != TLSIO_STATE_ERROR && tls_io_instance->tlsio_state != TLSIO_STATE_OPEN)
        {
            /* Codes_RS_TLSIO_30_053: [ If the adapter is in any state other than TLSIO_STATE_EXT_OPEN or TLSIO_STATE_EXT_ERROR then tlsio_close_async shall log that tlsio_close_async has been called and then continue normally. ]*/
            // LogInfo rather than LogError because this is an unusual but not erroneous situation
            LogInfo("Closing tlsio from a state other than TLSIO_STATE_EXT_OPEN or TLSIO_STATE_EXT_ERROR");
        }

        if (is_an_opening_state(tls_io_instance->tlsio_state))
        {
            /* Codes_SRS_TLSIO_30_057: [ On success, if the adapter is in TLSIO_STATE_EXT_OPENING, it shall call on_io_open_complete with the on_io_open_complete_context supplied in tlsio_open_async and IO_OPEN_CANCELLED. This callback shall be made before changing the internal state of the adapter. ]*/
            tls_io_instance->on_io_open_complete(tls_io_instance->on_io_open_complete_context, IO_OPEN_CANCELLED);
        }

        if (tls_io_instance->tlsio_state == TLSIO_STATE_OPEN)
        {
            // Attempt a graceful shutdown
            /* Codes_SRS_TLSIO_30_056: [ On success the adapter shall enter TLSIO_STATE_EX_CLOSING. ]*/
            tls_io_instance->tlsio_state = TLSIO_STATE_CLOSING;
            tls_io_instance->on_io_close_complete = on_io_close_complete;
            tls_io_instance->on_io_close_complete_context = callback_context;
            // xio_close is guaranteed to succeed from the open state, and the callback completes the
            // transition into TLSIO_STATE_NOT_OPEN
            if (xio_close(tls_io_instance->underlying_io, on_underlying_io_close_complete, tls_io_instance) != 0)
            {
                close_openssl_instance(tls_io_instance);
                tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
            }
        }
        else
        {
            // Just force the shutdown
            /* Codes_SRS_TLSIO_30_056: [ On success the adapter shall enter TLSIO_STATE_EX_CLOSING. ]*/
            /* Codes_SRS_TLSIO_30_051: [ On success, if the underlying TLS does not support asynchronous closing or if the adapter is not in TLSIO_STATE_EXT_OPEN, then the adapter shall enter TLSIO_STATE_EXT_CLOSED immediately after entering TLSIO_STATE_EXT_CLOSING. ]*/
            // Current implementations of xio_close will fail if not in the open state, but we don't care
            (void)xio_close(tls_io_instance->underlying_io, NULL, NULL);
            close_openssl_instance(tls_io_instance);
            tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
        }

        result = 0;
    }
    /* Codes_SRS_TLSIO_30_054: [ On failure, the adapter shall not call on_io_close_complete. ]*/

    return result;
}